

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> * __thiscall
tinyusdz::GeomMesh::get_normals
          (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
           *__return_storage_ptr__,GeomMesh *this,double time,TimeSampleInterpolationType interp)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *this_00;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  value_type *this_01;
  storage_t<unsigned_int> elementSize;
  char cVar5;
  vector<int,_std::allocator<int>_> indices;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> value;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> expanded_normals;
  string err;
  GeomPrimvar primvar;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&primvar,"normals",(allocator *)&value);
  bVar1 = GPrim::has_primvar(&this->super_GPrim,&primvar._name);
  ::std::__cxx11::string::_M_dispose();
  if (bVar1) {
    GeomPrimvar::GeomPrimvar(&primvar);
    ::std::__cxx11::string::string((string *)&value,"normals",(allocator *)&indices);
    bVar1 = GPrim::get_primvar(&this->super_GPrim,(string *)&value,&primvar,&err);
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      GeomPrimvar::flatten_with_indices<tinyusdz::value::normal3f>
                (&primvar,time,__return_storage_ptr__,interp,(string *)0x0);
    }
    GeomPrimvar::~GeomPrimvar(&primvar);
    goto LAB_003670a9;
  }
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
          ::authored(&this->normals);
  if ((!bVar1) ||
     ((((this->normals)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->normals)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_start && (((this->normals)._attrib.has_value_ & 1U) == 0)
       ) || ((this->normals)._blocked != false)))) goto LAB_003670a9;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_GPrim).props;
  ::std::__cxx11::string::string((string *)&primvar,"normals:indices",(allocator *)&value);
  sVar3 = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::count(this_00,&primvar._name);
  ::std::__cxx11::string::_M_dispose();
  if (sVar3 == 0) {
    bVar1 = false;
LAB_00366f9a:
    value.super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
    ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                *)&primvar,&(this->normals)._attrib);
    this_01 = nonstd::optional_lite::
              optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
              ::value((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                       *)&primvar);
    bVar2 = Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
            ::get(this_01,time,&value,interp);
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
    ::~optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                 *)&primvar);
    if (bVar2) {
      if (indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
        operator=(__return_storage_ptr__,&value);
        cVar5 = '\x01';
      }
      else {
        if ((this->normals)._metas.elementSize.has_value_ == false) {
          elementSize = (storage_t<unsigned_int>)0x1;
        }
        else {
          elementSize = (this->normals)._metas.elementSize.contained;
        }
        expanded_normals.
        super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        expanded_normals.
        super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        expanded_normals.
        super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3f>
                  ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&primvar,&value,(uint32_t)elementSize,&indices,&expanded_normals);
        bVar2 = true;
        if (primvar._has_value == true) {
          ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
          operator=(__return_storage_ptr__,&expanded_normals);
          bVar2 = bVar1;
        }
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&primvar);
        ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
        ~_Vector_base(&expanded_normals.
                       super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                     );
        cVar5 = primvar._has_value;
        bVar1 = bVar2;
      }
    }
    else {
      bVar1 = true;
      cVar5 = '\0';
    }
    ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
    ~_Vector_base(&value.
                   super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                 );
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&value,"normals:indices",(allocator *)&expanded_normals);
    pmVar4 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::at(this_00,(key_type *)&value);
    Attribute::Attribute((Attribute *)&primvar,&pmVar4->_attrib);
    ::std::__cxx11::string::_M_dispose();
    bVar1 = Attribute::is_connection((Attribute *)&primvar);
    if (bVar1) {
      bVar1 = true;
      bVar2 = false;
    }
    else {
      bVar2 = Attribute::get<std::vector<int,std::allocator<int>>>
                        ((Attribute *)&primvar,time,&indices,interp);
      bVar1 = !bVar2;
    }
    Attribute::~Attribute((Attribute *)&primvar);
    if (bVar2 != false) goto LAB_00366f9a;
    cVar5 = '\0';
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indices.super__Vector_base<int,_std::allocator<int>_>);
  if (cVar5 == '\0') {
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      return __return_storage_ptr__;
    }
    ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
    ~_Vector_base(&__return_storage_ptr__->
                   super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                 );
    return __return_storage_ptr__;
  }
LAB_003670a9:
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

const std::vector<value::normal3f> GeomMesh::get_normals(
    double time, value::TimeSampleInterpolationType interp) const {
  std::vector<value::normal3f> dst;

  std::string err;
  if (has_primvar("normals")) {
    GeomPrimvar primvar;
    if (!get_primvar("normals", &primvar, &err)) {
      return dst;
    }

    primvar.flatten_with_indices(time, &dst, interp);
    return dst;
  } else if (normals.authored()) {
    if (normals.is_connection()) {
      // Not supported
      return dst;
    } else if (normals.is_blocked()) {
      return dst;
    }

    std::vector<int> indices;
    if (props.count("normals:indices")) {
      Attribute indexAttr = props.at("normals:indices").get_attribute();

      if (indexAttr.is_connection()) {
        // not supported.
        return dst;
      }

      if (!indexAttr.get_value(time, &indices, interp)) {
        // err
        return dst;
      }

    }

    std::vector<value::normal3f> value;
    if (!normals.get_value().value().get(time, &value, interp)) {
      return dst;
    }

    if (indices.size()) {
      uint32_t elementSize = normals.metas().elementSize.value_or(1);

      std::vector<value::normal3f> expanded_normals;
      auto ret = ExpandWithIndices(value, elementSize, indices, &expanded_normals);

      if (!ret) {
        return dst;
      }

      dst = expanded_normals;
    } else {
      dst = value;
    }
  }

  return dst;
}